

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O1

ExprTree * __thiscall
PcodeCompile::createOpOutUnary(PcodeCompile *this,VarnodeTpl *outvn,OpCode opc,ExprTree *vn)

{
  vector<OpTpl*,std::allocator<OpTpl*>> *this_00;
  iterator __position;
  VarnodeTpl *this_01;
  OpTpl *op;
  OpTpl *local_28;
  
  local_28 = (OpTpl *)operator_new(0x28);
  (local_28->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_28->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_28->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28->opc = opc;
  local_28->output = (VarnodeTpl *)0x0;
  OpTpl::addInput(local_28,vn->outvn);
  local_28->output = outvn;
  this_00 = (vector<OpTpl*,std::allocator<OpTpl*>> *)vn->ops;
  __position._M_current = *(OpTpl ***)(this_00 + 8);
  if (__position._M_current == *(OpTpl ***)(this_00 + 0x10)) {
    std::vector<OpTpl*,std::allocator<OpTpl*>>::_M_realloc_insert<OpTpl*const&>
              (this_00,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  this_01 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_01,outvn);
  vn->outvn = this_01;
  return vn;
}

Assistant:

ExprTree *PcodeCompile::createOpOutUnary(VarnodeTpl *outvn,OpCode opc,ExprTree *vn)

{ // Create an op with explicit output and 1 input
  OpTpl *op = new OpTpl(opc);
  op->addInput(vn->outvn);
  op->setOutput(outvn);
  vn->ops->push_back(op);
  vn->outvn = new VarnodeTpl(*outvn);
  return vn;
}